

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O2

int nghttp2_check_method(uint8_t *value,size_t len)

{
  byte *pbVar1;
  size_t sVar2;
  
  if (len != 0) {
    sVar2 = 0;
    do {
      if (len == sVar2) {
        return 1;
      }
      pbVar1 = value + sVar2;
      sVar2 = sVar2 + 1;
    } while (""[*pbVar1] != '\0');
  }
  return 0;
}

Assistant:

int nghttp2_check_method(const uint8_t *value, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  for (last = value + len; value != last; ++value) {
    if (!VALID_METHOD_CHARS[*value]) {
      return 0;
    }
  }
  return 1;
}